

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
google::protobuf::compiler::cpp::MessageVars_abi_cxx11_
          (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cpp *this,Descriptor *desc)

{
  long lVar1;
  allocator_type local_613;
  key_equal local_612;
  hasher local_611;
  undefined1 local_610 [32];
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [32];
  undefined1 local_5b0 [32];
  undefined1 local_590 [32];
  undefined1 local_570 [32];
  undefined1 local_550 [64];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_510;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_450;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  AlphaNum local_300;
  string_view local_2d0;
  AlphaNum local_2a0;
  string_view local_270;
  AlphaNum local_240;
  string_view local_210;
  AlphaNum local_1e0;
  string_view local_1b0;
  AlphaNum local_180;
  string_view local_150;
  AlphaNum local_120;
  string_view local_f0;
  AlphaNum local_c0;
  string_view local_90;
  AlphaNum local_60;
  
  local_60.piece_._M_len = 7;
  local_60.piece_._M_str = "_impl_.";
  local_90 = absl::lts_20240722::NullSafeStringView("_any_metadata_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)(local_550 + 0x20),&local_60);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_510,(char (*) [13])"any_metadata",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_550 + 0x20)
            );
  local_c0.piece_._M_len = 7;
  local_c0.piece_._M_str = "_impl_.";
  local_f0 = absl::lts_20240722::NullSafeStringView("_cached_size_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_550,&local_c0);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_4e0,(char (*) [12])0x3635b2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550);
  local_120.piece_._M_len = 7;
  local_120.piece_._M_str = "_impl_.";
  local_150 = absl::lts_20240722::NullSafeStringView("_extensions_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_570,&local_120);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_4b0,(char (*) [11])0x3d9e45,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570);
  local_180.piece_._M_len = 7;
  local_180.piece_._M_str = "_impl_.";
  local_1b0 = absl::lts_20240722::NullSafeStringView("_has_bits_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_590,&local_180);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_480,(char (*) [9])0x3628e9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590);
  local_1e0.piece_._M_len = 7;
  local_1e0.piece_._M_str = "_impl_.";
  local_210 = absl::lts_20240722::NullSafeStringView("_inlined_string_donated_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_5b0,&local_1e0);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[29],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_450,(char (*) [29])"inlined_string_donated_array",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0);
  local_240.piece_._M_len = 7;
  local_240.piece_._M_str = "_impl_.";
  local_270 = absl::lts_20240722::NullSafeStringView("_oneof_case_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_5d0,&local_240);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_420,(char (*) [11])"oneof_case",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[17],_true>
            (&local_3f0,(char (*) [8])"tracker",(char (*) [17])"Impl_::_tracker_");
  local_2a0.piece_._M_len = 7;
  local_2a0.piece_._M_str = "_impl_.";
  local_2d0 = absl::lts_20240722::NullSafeStringView("_weak_field_map_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_5f0,&local_2a0);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3c0,(char (*) [15])"weak_field_map",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0);
  local_300.piece_._M_len = 7;
  local_300.piece_._M_str = "_impl_.";
  local_330.first = absl::lts_20240722::NullSafeStringView("_split_");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_610,&local_300);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_390,(char (*) [6])0x346997,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[17],_const_char_(&)[17],_true>
            (&local_360,(char (*) [17])"cached_split_ptr",(char (*) [17])"cached_split_ptr");
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)__return_storage_ptr__,&local_510,&local_330,0,&local_611,&local_612,&local_613);
  lVar1 = 0x1c0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_510.first._M_len + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)local_610);
  std::__cxx11::string::~string((string *)local_5f0);
  std::__cxx11::string::~string((string *)local_5d0);
  std::__cxx11::string::~string((string *)local_5b0);
  std::__cxx11::string::~string((string *)local_590);
  std::__cxx11::string::~string((string *)local_570);
  std::__cxx11::string::~string((string *)local_550);
  std::__cxx11::string::~string((string *)(local_550 + 0x20));
  return __return_storage_ptr__;
}

Assistant:

absl::flat_hash_map<absl::string_view, std::string> MessageVars(
    const Descriptor* desc) {
  absl::string_view prefix = "_impl_.";
  return {
      {"any_metadata", absl::StrCat(prefix, "_any_metadata_")},
      {"cached_size", absl::StrCat(prefix, "_cached_size_")},
      {"extensions", absl::StrCat(prefix, "_extensions_")},
      {"has_bits", absl::StrCat(prefix, "_has_bits_")},
      {"inlined_string_donated_array",
       absl::StrCat(prefix, "_inlined_string_donated_")},
      {"oneof_case", absl::StrCat(prefix, "_oneof_case_")},
      {"tracker", "Impl_::_tracker_"},
      {"weak_field_map", absl::StrCat(prefix, "_weak_field_map_")},
      {"split", absl::StrCat(prefix, "_split_")},
      {"cached_split_ptr", "cached_split_ptr"},
  };
}